

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void aom_highbd_lpf_horizontal_14_dual_sse2
               (uint16_t *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined8 uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  long lVar5;
  long lVar6;
  ushort uVar7;
  ushort uVar10;
  ushort uVar11;
  ulong uVar8;
  ushort uVar12;
  short sVar13;
  ushort uVar14;
  short sVar16;
  ushort uVar17;
  short sVar18;
  ushort uVar19;
  ulong uVar15;
  undefined1 auVar9 [16];
  short sVar20;
  ushort uVar21;
  short sVar22;
  ushort uVar23;
  short sVar25;
  ushort uVar26;
  short sVar27;
  ushort uVar28;
  ulong uVar24;
  short sVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  short sVar34;
  ushort uVar35;
  short sVar36;
  ushort uVar37;
  ulong uVar33;
  short sVar38;
  short sVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  short sVar49;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined1 auVar50 [16];
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  __m128i qs [2];
  __m128i ps [2];
  ushort local_368;
  ushort uStack_366;
  ushort uStack_364;
  ushort uStack_362;
  ushort uStack_360;
  ushort uStack_35e;
  ushort uStack_35c;
  ushort uStack_35a;
  ushort local_358;
  ushort uStack_356;
  ushort uStack_354;
  ushort uStack_352;
  ushort uStack_350;
  ushort uStack_34e;
  ushort uStack_34c;
  ushort uStack_34a;
  __m128i flat_q [3];
  __m128i flat_p [3];
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  ushort local_2c8;
  ushort uStack_2c6;
  ushort uStack_2c4;
  ushort uStack_2c2;
  ushort uStack_2c0;
  ushort uStack_2be;
  ushort uStack_2bc;
  ushort uStack_2ba;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  ushort local_258;
  ushort uStack_256;
  ushort uStack_254;
  ushort uStack_252;
  ushort uStack_250;
  ushort uStack_24e;
  ushort uStack_24c;
  ushort uStack_24a;
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  undefined1 local_218 [16];
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  __m128i mask;
  __m128i t80;
  __m128i thresh;
  __m128i limit;
  ushort local_128 [48];
  __m128i flat2_p [6];
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  __m128i blimit;
  
  lVar6 = (long)pitch;
  puVar4 = s + -lVar6;
  puVar3 = s;
  for (lVar5 = 0; lVar5 != 0x70; lVar5 = lVar5 + 0x10) {
    uVar1 = *(undefined8 *)(puVar4 + 4);
    *(undefined8 *)((long)&local_2e8 + lVar5) = *(undefined8 *)puVar4;
    *(undefined8 *)((long)&uStack_2e0 + lVar5) = uVar1;
    uVar1 = *(undefined8 *)(puVar3 + 4);
    *(undefined8 *)((long)&local_278 + lVar5) = *(undefined8 *)puVar3;
    *(undefined8 *)((long)&uStack_270 + lVar5) = uVar1;
    puVar3 = puVar3 + lVar6;
    puVar4 = puVar4 + -lVar6;
  }
  get_limit_dual(_blimit0,_limit0,_thresh0,_blimit1,_limit1,_thresh1,bd,&blimit,&limit,&thresh,&t80)
  ;
  highbd_filter_mask_dual((__m128i *)&local_2e8,(__m128i *)&local_278,&limit,&blimit,&mask);
  highbd_flat_mask4_dual_sse2
            ((__m128i *)&local_2e8,(__m128i *)&local_278,(__m128i *)&local_58,(__m128i *)&local_68,
             bd);
  uVar24 = mask[0] & local_58;
  uVar33 = mask[1] & uStack_50;
  uVar8 = local_68 & uVar24;
  uVar15 = uStack_60 & uVar33;
  highbd_filter4_dual_sse2((__m128i *)&local_2e8,(__m128i *)&local_278,ps,qs,&mask,&thresh,bd,&t80);
  local_358 = (ushort)uVar24;
  uStack_356 = (ushort)(uVar24 >> 0x10);
  uStack_354 = (ushort)(uVar24 >> 0x20);
  uStack_352 = (ushort)(uVar24 >> 0x30);
  uStack_350 = (ushort)uVar33;
  uStack_34e = (ushort)(uVar33 >> 0x10);
  uStack_34c = (ushort)(uVar33 >> 0x20);
  uStack_34a = (ushort)(uVar33 >> 0x30);
  auVar50._0_2_ = -(ushort)(local_358 == 0);
  auVar50._2_2_ = -(ushort)(uStack_356 == 0);
  auVar50._4_2_ = -(ushort)(uStack_354 == 0);
  auVar50._6_2_ = -(ushort)(uStack_352 == 0);
  auVar50._8_2_ = -(ushort)(uStack_350 == 0);
  auVar50._10_2_ = -(ushort)(uStack_34e == 0);
  auVar50._12_2_ = -(ushort)(uStack_34c == 0);
  auVar50._14_2_ = -(ushort)(uStack_34a == 0);
  if ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar50._14_2_ >> 7) & 1) << 0xe | auVar50._14_2_ & 0x8000) == 0xffff
     ) {
    local_2e8 = ps[0][0];
    uStack_2e0 = ps[0][1];
    local_278 = qs[0][0];
    uStack_270 = qs[0][1];
    local_2d8 = ps[1][0];
    uStack_2d0 = ps[1][1];
    local_268 = qs[1][0];
    uStack_260 = qs[1][1];
  }
  else {
    sVar74 = (short)local_2d8 + (short)local_2e8 + local_2c8;
    sVar75 = local_2d8._2_2_ + local_2e8._2_2_ + uStack_2c6;
    sVar76 = local_2d8._4_2_ + local_2e8._4_2_ + uStack_2c4;
    sVar77 = local_2d8._6_2_ + local_2e8._6_2_ + uStack_2c2;
    sVar78 = (short)uStack_2d0 + (short)uStack_2e0 + uStack_2c0;
    sVar79 = uStack_2d0._2_2_ + uStack_2e0._2_2_ + uStack_2be;
    sVar80 = uStack_2d0._4_2_ + uStack_2e0._4_2_ + uStack_2bc;
    sVar81 = uStack_2d0._6_2_ + uStack_2e0._6_2_ + uStack_2ba;
    sVar49 = (short)local_268 + (short)local_278 + local_258;
    sVar51 = local_268._2_2_ + local_278._2_2_ + uStack_256;
    sVar52 = local_268._4_2_ + local_278._4_2_ + uStack_254;
    sVar53 = local_268._6_2_ + local_278._6_2_ + uStack_252;
    sVar54 = (short)uStack_260 + (short)uStack_270 + uStack_250;
    sVar55 = uStack_260._2_2_ + uStack_270._2_2_ + uStack_24e;
    sVar56 = uStack_260._4_2_ + uStack_270._4_2_ + uStack_24c;
    sVar57 = uStack_260._6_2_ + uStack_270._6_2_ + uStack_24a;
    sVar58 = sVar49 + sVar74;
    sVar59 = sVar51 + sVar75;
    sVar60 = sVar52 + sVar76;
    sVar61 = sVar53 + sVar77;
    sVar62 = sVar54 + sVar78;
    sVar63 = sVar55 + sVar79;
    sVar64 = sVar56 + sVar80;
    sVar65 = sVar57 + sVar81;
    sVar22 = sVar58 + 4;
    sVar25 = sVar59 + 4;
    sVar27 = sVar60 + 4;
    sVar29 = sVar61 + 4;
    sVar31 = sVar62 + 4;
    sVar34 = sVar63 + 4;
    sVar36 = sVar64 + 4;
    sVar38 = sVar65 + 4;
    flat_p[0][0]._0_2_ = (ushort)((short)local_2e8 + local_2b8 + sVar22) >> 3;
    flat_p[0][0]._2_2_ = (ushort)(local_2e8._2_2_ + sStack_2b6 + sVar25) >> 3;
    flat_p[0][0]._4_2_ = (ushort)(local_2e8._4_2_ + sStack_2b4 + sVar27) >> 3;
    flat_p[0][0]._6_2_ = (ushort)(local_2e8._6_2_ + sStack_2b2 + sVar29) >> 3;
    flat_p[0][1]._0_2_ = (ushort)((short)uStack_2e0 + sStack_2b0 + sVar31) >> 3;
    flat_p[0][1]._2_2_ = (ushort)(uStack_2e0._2_2_ + sStack_2ae + sVar34) >> 3;
    flat_p[0][1]._4_2_ = (ushort)(uStack_2e0._4_2_ + sStack_2ac + sVar36) >> 3;
    flat_p[0][1]._6_2_ = (ushort)(uStack_2e0._6_2_ + sStack_2aa + sVar38) >> 3;
    flat_q[0][0]._0_2_ = (ushort)((short)local_278 + local_248 + sVar22) >> 3;
    flat_q[0][0]._2_2_ = (ushort)(local_278._2_2_ + sStack_246 + sVar25) >> 3;
    flat_q[0][0]._4_2_ = (ushort)(local_278._4_2_ + sStack_244 + sVar27) >> 3;
    flat_q[0][0]._6_2_ = (ushort)(local_278._6_2_ + sStack_242 + sVar29) >> 3;
    flat_q[0][1]._0_2_ = (ushort)((short)uStack_270 + sStack_240 + sVar31) >> 3;
    flat_q[0][1]._2_2_ = (ushort)(uStack_270._2_2_ + sStack_23e + sVar34) >> 3;
    flat_q[0][1]._4_2_ = (ushort)(uStack_270._4_2_ + sStack_23c + sVar36) >> 3;
    flat_q[0][1]._6_2_ = (ushort)(uStack_270._6_2_ + sStack_23a + sVar38) >> 3;
    flat_p[1][0]._0_2_ = (ushort)(local_2b8 * 2 + (short)local_2d8 + (sVar22 - local_258)) >> 3;
    flat_p[1][0]._2_2_ = (ushort)(sStack_2b6 * 2 + local_2d8._2_2_ + (sVar25 - uStack_256)) >> 3;
    flat_p[1][0]._4_2_ = (ushort)(sStack_2b4 * 2 + local_2d8._4_2_ + (sVar27 - uStack_254)) >> 3;
    flat_p[1][0]._6_2_ = (ushort)(sStack_2b2 * 2 + local_2d8._6_2_ + (sVar29 - uStack_252)) >> 3;
    flat_p[1][1]._0_2_ = (ushort)(sStack_2b0 * 2 + (short)uStack_2d0 + (sVar31 - uStack_250)) >> 3;
    flat_p[1][1]._2_2_ = (ushort)(sStack_2ae * 2 + uStack_2d0._2_2_ + (sVar34 - uStack_24e)) >> 3;
    flat_p[1][1]._4_2_ = (ushort)(sStack_2ac * 2 + uStack_2d0._4_2_ + (sVar36 - uStack_24c)) >> 3;
    flat_p[1][1]._6_2_ = (ushort)(sStack_2aa * 2 + uStack_2d0._6_2_ + (sVar38 - uStack_24a)) >> 3;
    flat_q[1][0]._0_2_ = (ushort)(local_248 * 2 + (short)local_268 + (sVar22 - local_2c8)) >> 3;
    flat_q[1][0]._2_2_ = (ushort)(sStack_246 * 2 + local_268._2_2_ + (sVar25 - uStack_2c6)) >> 3;
    flat_q[1][0]._4_2_ = (ushort)(sStack_244 * 2 + local_268._4_2_ + (sVar27 - uStack_2c4)) >> 3;
    flat_q[1][0]._6_2_ = (ushort)(sStack_242 * 2 + local_268._6_2_ + (sVar29 - uStack_2c2)) >> 3;
    flat_q[1][1]._0_2_ = (ushort)(sStack_240 * 2 + (short)uStack_260 + (sVar31 - uStack_2c0)) >> 3;
    flat_q[1][1]._2_2_ = (ushort)(sStack_23e * 2 + uStack_260._2_2_ + (sVar34 - uStack_2be)) >> 3;
    flat_q[1][1]._4_2_ = (ushort)(sStack_23c * 2 + uStack_260._4_2_ + (sVar36 - uStack_2bc)) >> 3;
    flat_q[1][1]._6_2_ = (ushort)(sStack_23a * 2 + uStack_260._6_2_ + (sVar38 - uStack_2ba)) >> 3;
    flat_p[2][0]._0_2_ =
         (ushort)(((local_2b8 * 3 + local_2c8) - (short)local_268) + (sVar22 - local_258)) >> 3;
    flat_p[2][0]._2_2_ =
         (ushort)(((sStack_2b6 * 3 + uStack_2c6) - local_268._2_2_) + (sVar25 - uStack_256)) >> 3;
    flat_p[2][0]._4_2_ =
         (ushort)(((sStack_2b4 * 3 + uStack_2c4) - local_268._4_2_) + (sVar27 - uStack_254)) >> 3;
    flat_p[2][0]._6_2_ =
         (ushort)(((sStack_2b2 * 3 + uStack_2c2) - local_268._6_2_) + (sVar29 - uStack_252)) >> 3;
    flat_p[2][1]._0_2_ =
         (ushort)(((sStack_2b0 * 3 + uStack_2c0) - (short)uStack_260) + (sVar31 - uStack_250)) >> 3;
    flat_p[2][1]._2_2_ =
         (ushort)(((sStack_2ae * 3 + uStack_2be) - uStack_260._2_2_) + (sVar34 - uStack_24e)) >> 3;
    flat_p[2][1]._4_2_ =
         (ushort)(((sStack_2ac * 3 + uStack_2bc) - uStack_260._4_2_) + (sVar36 - uStack_24c)) >> 3;
    flat_p[2][1]._6_2_ =
         (ushort)(((sStack_2aa * 3 + uStack_2ba) - uStack_260._6_2_) + (sVar38 - uStack_24a)) >> 3;
    flat_q[2][0]._0_2_ =
         (ushort)((local_248 * 3 - (short)local_2d8) + local_258 + (sVar22 - local_2c8)) >> 3;
    flat_q[2][0]._2_2_ =
         (ushort)((sStack_246 * 3 - local_2d8._2_2_) + uStack_256 + (sVar25 - uStack_2c6)) >> 3;
    flat_q[2][0]._4_2_ =
         (ushort)((sStack_244 * 3 - local_2d8._4_2_) + uStack_254 + (sVar27 - uStack_2c4)) >> 3;
    flat_q[2][0]._6_2_ =
         (ushort)((sStack_242 * 3 - local_2d8._6_2_) + uStack_252 + (sVar29 - uStack_2c2)) >> 3;
    flat_q[2][1]._0_2_ =
         (ushort)((sStack_240 * 3 - (short)uStack_2d0) + uStack_250 + (sVar31 - uStack_2c0)) >> 3;
    flat_q[2][1]._2_2_ =
         (ushort)((sStack_23e * 3 - uStack_2d0._2_2_) + uStack_24e + (sVar34 - uStack_2be)) >> 3;
    flat_q[2][1]._4_2_ =
         (ushort)((sStack_23c * 3 - uStack_2d0._4_2_) + uStack_24c + (sVar36 - uStack_2bc)) >> 3;
    flat_q[2][1]._6_2_ =
         (ushort)((sStack_23a * 3 - uStack_2d0._6_2_) + uStack_24a + (sVar38 - uStack_2ba)) >> 3;
    local_368 = (ushort)uVar8;
    uStack_366 = (ushort)(uVar8 >> 0x10);
    uStack_364 = (ushort)(uVar8 >> 0x20);
    uStack_362 = (ushort)(uVar8 >> 0x30);
    uStack_360 = (ushort)uVar15;
    uStack_35e = (ushort)(uVar15 >> 0x10);
    uStack_35c = (ushort)(uVar15 >> 0x20);
    uStack_35a = (ushort)(uVar15 >> 0x30);
    auVar9._0_2_ = -(ushort)(local_368 == 0);
    auVar9._2_2_ = -(ushort)(uStack_366 == 0);
    auVar9._4_2_ = -(ushort)(uStack_364 == 0);
    auVar9._6_2_ = -(ushort)(uStack_362 == 0);
    auVar9._8_2_ = -(ushort)(uStack_360 == 0);
    auVar9._10_2_ = -(ushort)(uStack_35e == 0);
    auVar9._12_2_ = -(ushort)(uStack_35c == 0);
    auVar9._14_2_ = -(ushort)(uStack_35a == 0);
    uVar2 = ((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
             (ushort)((byte)(auVar9._14_2_ >> 7) & 1) << 0xe | auVar9._14_2_ & 0x8000) ^ 0xffff;
    if (uVar2 != 0) {
      sVar22 = local_2a8 + local_298 + local_2b8;
      sVar27 = sStack_2a6 + sStack_296 + sStack_2b6;
      sVar31 = sStack_2a4 + sStack_294 + sStack_2b4;
      sVar36 = sStack_2a2 + sStack_292 + sStack_2b2;
      sVar13 = sStack_2a0 + sStack_290 + sStack_2b0;
      sVar16 = sStack_29e + sStack_28e + sStack_2ae;
      sVar18 = sStack_29c + sStack_28c + sStack_2ac;
      sVar20 = sStack_29a + sStack_28a + sStack_2aa;
      local_208 = local_228 + local_238 + local_248;
      sStack_206 = sStack_226 + sStack_236 + sStack_246;
      sStack_204 = sStack_224 + sStack_234 + sStack_244;
      sStack_202 = sStack_222 + sStack_232 + sStack_242;
      sStack_200 = sStack_220 + sStack_230 + sStack_240;
      sStack_1fe = sStack_21e + sStack_22e + sStack_23e;
      sStack_1fc = sStack_21c + sStack_22c + sStack_23c;
      sVar39 = sStack_21a + sStack_22a + sStack_23a;
      sVar82 = local_288._0_2_;
      sVar83 = local_288._2_2_;
      sVar84 = local_288._4_2_;
      sVar85 = local_288._6_2_;
      sVar86 = local_288._8_2_;
      sVar87 = local_288._10_2_;
      sVar88 = local_288._12_2_;
      sVar89 = local_288._14_2_;
      sVar25 = sVar22 + local_208 + sVar58 + 8;
      sVar29 = sVar27 + sStack_206 + sVar59 + 8;
      sVar34 = sVar31 + sStack_204 + sVar60 + 8;
      sVar38 = sVar36 + sStack_202 + sVar61 + 8;
      sVar58 = sVar13 + sStack_200 + sVar62 + 8;
      sVar59 = sVar16 + sStack_1fe + sVar63 + 8;
      sVar60 = sVar18 + sStack_1fc + sVar64 + 8;
      sVar61 = sVar20 + sVar39 + sVar65 + 8;
      sVar66 = local_218._0_2_;
      sVar67 = local_218._2_2_;
      sVar68 = local_218._4_2_;
      sVar69 = local_218._6_2_;
      sVar70 = local_218._8_2_;
      sVar71 = local_218._10_2_;
      sVar72 = local_218._12_2_;
      sVar73 = local_218._14_2_;
      flat2_p[0][0]._0_2_ =
           (ushort)((short)local_2d8 + (short)local_2e8 + (short)local_278 + sVar82 + sVar25) >> 4;
      flat2_p[0][0]._2_2_ =
           (ushort)(local_2d8._2_2_ + local_2e8._2_2_ + local_278._2_2_ + sVar83 + sVar29) >> 4;
      flat2_p[0][0]._4_2_ =
           (ushort)(local_2d8._4_2_ + local_2e8._4_2_ + local_278._4_2_ + sVar84 + sVar34) >> 4;
      flat2_p[0][0]._6_2_ =
           (ushort)(local_2d8._6_2_ + local_2e8._6_2_ + local_278._6_2_ + sVar85 + sVar38) >> 4;
      flat2_p[0][1]._0_2_ =
           (ushort)((short)uStack_2d0 + (short)uStack_2e0 + (short)uStack_270 + sVar86 + sVar58) >>
           4;
      flat2_p[0][1]._2_2_ =
           (ushort)(uStack_2d0._2_2_ + uStack_2e0._2_2_ + uStack_270._2_2_ + sVar87 + sVar59) >> 4;
      flat2_p[0][1]._4_2_ =
           (ushort)(uStack_2d0._4_2_ + uStack_2e0._4_2_ + uStack_270._4_2_ + sVar88 + sVar60) >> 4;
      flat2_p[0][1]._6_2_ =
           (ushort)(uStack_2d0._6_2_ + uStack_2e0._6_2_ + uStack_270._6_2_ + sVar89 + sVar61) >> 4;
      local_128[0] = (ushort)((short)local_268 + (short)local_278 + (short)local_2e8 + sVar66 +
                             sVar25) >> 4;
      local_128[1] = (ushort)(local_268._2_2_ + local_278._2_2_ + local_2e8._2_2_ + sVar67 + sVar29)
                     >> 4;
      local_128[2] = (ushort)(local_268._4_2_ + local_278._4_2_ + local_2e8._4_2_ + sVar68 + sVar34)
                     >> 4;
      local_128[3] = (ushort)(local_268._6_2_ + local_278._6_2_ + local_2e8._6_2_ + sVar69 + sVar38)
                     >> 4;
      local_128[4] = (ushort)((short)uStack_260 + (short)uStack_270 + (short)uStack_2e0 + sVar70 +
                             sVar58) >> 4;
      local_128[5] = (ushort)(uStack_260._2_2_ + uStack_270._2_2_ + uStack_2e0._2_2_ + sVar71 +
                             sVar59) >> 4;
      local_128[6] = (ushort)(uStack_260._4_2_ + uStack_270._4_2_ + uStack_2e0._4_2_ + sVar72 +
                             sVar60) >> 4;
      local_128[7] = (ushort)(uStack_260._6_2_ + uStack_270._6_2_ + uStack_2e0._6_2_ + sVar73 +
                             sVar61) >> 4;
      flat2_p[1][0]._0_2_ = (ushort)(sVar74 + sVar82 * 2 + (sVar25 - local_228)) >> 4;
      flat2_p[1][0]._2_2_ = (ushort)(sVar75 + sVar83 * 2 + (sVar29 - sStack_226)) >> 4;
      flat2_p[1][0]._4_2_ = (ushort)(sVar76 + sVar84 * 2 + (sVar34 - sStack_224)) >> 4;
      flat2_p[1][0]._6_2_ = (ushort)(sVar77 + sVar85 * 2 + (sVar38 - sStack_222)) >> 4;
      flat2_p[1][1]._0_2_ = (ushort)(sVar78 + sVar86 * 2 + (sVar58 - sStack_220)) >> 4;
      flat2_p[1][1]._2_2_ = (ushort)(sVar79 + sVar87 * 2 + (sVar59 - sStack_21e)) >> 4;
      flat2_p[1][1]._4_2_ = (ushort)(sVar80 + sVar88 * 2 + (sVar60 - sStack_21c)) >> 4;
      flat2_p[1][1]._6_2_ = (ushort)(sVar81 + sVar89 * 2 + (sVar61 - sStack_21a)) >> 4;
      local_128[8] = (ushort)(sVar49 + sVar66 * 2 + (sVar25 - local_298)) >> 4;
      local_128[9] = (ushort)(sVar51 + sVar67 * 2 + (sVar29 - sStack_296)) >> 4;
      local_128[10] = (ushort)(sVar52 + sVar68 * 2 + (sVar34 - sStack_294)) >> 4;
      local_128[0xb] = (ushort)(sVar53 + sVar69 * 2 + (sVar38 - sStack_292)) >> 4;
      local_128[0xc] = (ushort)(sVar54 + sVar70 * 2 + (sVar58 - sStack_290)) >> 4;
      local_128[0xd] = (ushort)(sVar55 + sVar71 * 2 + (sVar59 - sStack_28e)) >> 4;
      local_128[0xe] = (ushort)(sVar56 + sVar72 * 2 + (sVar60 - sStack_28c)) >> 4;
      local_128[0xf] = (ushort)(sVar57 + sVar73 * 2 + (sVar61 - sStack_28a)) >> 4;
      sVar54 = (sVar25 - local_228) - local_238;
      sVar55 = (sVar29 - sStack_226) - sStack_236;
      sVar56 = (sVar34 - sStack_224) - sStack_234;
      sVar57 = (sVar38 - sStack_222) - sStack_232;
      sVar62 = (sVar58 - sStack_220) - sStack_230;
      sVar63 = (sVar59 - sStack_21e) - sStack_22e;
      sVar64 = (sVar60 - sStack_21c) - sStack_22c;
      sVar65 = (sVar61 - sStack_21a) - sStack_22a;
      flat2_p[2][0]._0_2_ =
           (ushort)((short)local_2d8 + local_2c8 + local_2b8 + sVar82 * 3 + sVar54) >> 4;
      flat2_p[2][0]._2_2_ =
           (ushort)(local_2d8._2_2_ + uStack_2c6 + sStack_2b6 + sVar83 * 3 + sVar55) >> 4;
      flat2_p[2][0]._4_2_ =
           (ushort)(local_2d8._4_2_ + uStack_2c4 + sStack_2b4 + sVar84 * 3 + sVar56) >> 4;
      flat2_p[2][0]._6_2_ =
           (ushort)(local_2d8._6_2_ + uStack_2c2 + sStack_2b2 + sVar85 * 3 + sVar57) >> 4;
      flat2_p[2][1]._0_2_ =
           (ushort)((short)uStack_2d0 + uStack_2c0 + sStack_2b0 + sVar86 * 3 + sVar62) >> 4;
      flat2_p[2][1]._2_2_ =
           (ushort)(uStack_2d0._2_2_ + uStack_2be + sStack_2ae + sVar87 * 3 + sVar63) >> 4;
      flat2_p[2][1]._4_2_ =
           (ushort)(uStack_2d0._4_2_ + uStack_2bc + sStack_2ac + sVar88 * 3 + sVar64) >> 4;
      flat2_p[2][1]._6_2_ =
           (ushort)(uStack_2d0._6_2_ + uStack_2ba + sStack_2aa + sVar89 * 3 + sVar65) >> 4;
      sVar25 = (sVar25 - local_298) - local_2a8;
      sVar29 = (sVar29 - sStack_296) - sStack_2a6;
      sVar34 = (sVar34 - sStack_294) - sStack_2a4;
      sVar38 = (sVar38 - sStack_292) - sStack_2a2;
      sVar49 = (sVar58 - sStack_290) - sStack_2a0;
      sVar51 = (sVar59 - sStack_28e) - sStack_29e;
      sVar52 = (sVar60 - sStack_28c) - sStack_29c;
      sVar53 = (sVar61 - sStack_28a) - sStack_29a;
      local_128[0x10] =
           (ushort)((short)local_268 + local_258 + local_248 + sVar66 * 3 + sVar25) >> 4;
      local_128[0x11] =
           (ushort)(local_268._2_2_ + uStack_256 + sStack_246 + sVar67 * 3 + sVar29) >> 4;
      local_128[0x12] =
           (ushort)(local_268._4_2_ + uStack_254 + sStack_244 + sVar68 * 3 + sVar34) >> 4;
      local_128[0x13] =
           (ushort)(local_268._6_2_ + uStack_252 + sStack_242 + sVar69 * 3 + sVar38) >> 4;
      local_128[0x14] =
           (ushort)((short)uStack_260 + uStack_250 + sStack_240 + sVar70 * 3 + sVar49) >> 4;
      local_128[0x15] =
           (ushort)(uStack_260._2_2_ + uStack_24e + sStack_23e + sVar71 * 3 + sVar51) >> 4;
      local_128[0x16] =
           (ushort)(uStack_260._4_2_ + uStack_24c + sStack_23c + sVar72 * 3 + sVar52) >> 4;
      local_128[0x17] =
           (ushort)(uStack_260._6_2_ + uStack_24a + sStack_23a + sVar73 * 3 + sVar53) >> 4;
      sVar25 = sVar25 - local_2b8;
      sVar29 = sVar29 - sStack_2b6;
      sVar34 = sVar34 - sStack_2b4;
      sVar38 = sVar38 - sStack_2b2;
      sVar49 = sVar49 - sStack_2b0;
      sVar51 = sVar51 - sStack_2ae;
      sVar52 = sVar52 - sStack_2ac;
      sVar53 = sVar53 - sStack_2aa;
      auVar50 = psllw(local_288,2);
      sVar54 = sVar54 - local_248;
      sVar55 = sVar55 - sStack_246;
      sVar56 = sVar56 - sStack_244;
      sVar57 = sVar57 - sStack_242;
      sVar62 = sVar62 - sStack_240;
      sVar63 = sVar63 - sStack_23e;
      sVar64 = sVar64 - sStack_23c;
      sVar65 = sVar65 - sStack_23a;
      flat2_p[3][0]._0_2_ =
           (ushort)(local_2b8 + local_2a8 + local_2c8 + auVar50._0_2_ + sVar54) >> 4;
      flat2_p[3][0]._2_2_ =
           (ushort)(sStack_2b6 + sStack_2a6 + uStack_2c6 + auVar50._2_2_ + sVar55) >> 4;
      flat2_p[3][0]._4_2_ =
           (ushort)(sStack_2b4 + sStack_2a4 + uStack_2c4 + auVar50._4_2_ + sVar56) >> 4;
      flat2_p[3][0]._6_2_ =
           (ushort)(sStack_2b2 + sStack_2a2 + uStack_2c2 + auVar50._6_2_ + sVar57) >> 4;
      flat2_p[3][1]._0_2_ =
           (ushort)(sStack_2b0 + sStack_2a0 + uStack_2c0 + auVar50._8_2_ + sVar62) >> 4;
      flat2_p[3][1]._2_2_ =
           (ushort)(sStack_2ae + sStack_29e + uStack_2be + auVar50._10_2_ + sVar63) >> 4;
      flat2_p[3][1]._4_2_ =
           (ushort)(sStack_2ac + sStack_29c + uStack_2bc + auVar50._12_2_ + sVar64) >> 4;
      flat2_p[3][1]._6_2_ =
           (ushort)(sStack_2aa + sStack_29a + uStack_2ba + auVar50._14_2_ + sVar65) >> 4;
      auVar50 = psllw(local_218,2);
      local_128[0x18] = (ushort)(local_248 + local_238 + local_258 + auVar50._0_2_ + sVar25) >> 4;
      local_128[0x19] = (ushort)(sStack_246 + sStack_236 + uStack_256 + auVar50._2_2_ + sVar29) >> 4
      ;
      local_128[0x1a] = (ushort)(sStack_244 + sStack_234 + uStack_254 + auVar50._4_2_ + sVar34) >> 4
      ;
      local_128[0x1b] = (ushort)(sStack_242 + sStack_232 + uStack_252 + auVar50._6_2_ + sVar38) >> 4
      ;
      local_128[0x1c] = (ushort)(sStack_240 + sStack_230 + uStack_250 + auVar50._8_2_ + sVar49) >> 4
      ;
      local_128[0x1d] =
           (ushort)(sStack_23e + sStack_22e + uStack_24e + auVar50._10_2_ + sVar51) >> 4;
      local_128[0x1e] =
           (ushort)(sStack_23c + sStack_22c + uStack_24c + auVar50._12_2_ + sVar52) >> 4;
      local_128[0x1f] =
           (ushort)(sStack_23a + sStack_22a + uStack_24a + auVar50._14_2_ + sVar53) >> 4;
      sVar54 = sVar54 - local_258;
      sVar55 = sVar55 - uStack_256;
      sVar56 = sVar56 - uStack_254;
      sVar57 = sVar57 - uStack_252;
      sVar62 = sVar62 - uStack_250;
      sVar63 = sVar63 - uStack_24e;
      sVar64 = sVar64 - uStack_24c;
      sVar65 = sVar65 - uStack_24a;
      sVar25 = sVar25 - local_2c8;
      sVar29 = sVar29 - uStack_2c6;
      sVar34 = sVar34 - uStack_2c4;
      sVar38 = sVar38 - uStack_2c2;
      sVar49 = sVar49 - uStack_2c0;
      sVar51 = sVar51 - uStack_2be;
      sVar52 = sVar52 - uStack_2bc;
      sVar53 = sVar53 - uStack_2ba;
      flat2_p[4][0]._0_2_ = (ushort)(sVar82 * 5 + sVar22 + sVar54) >> 4;
      flat2_p[4][0]._2_2_ = (ushort)(sVar83 * 5 + sVar27 + sVar55) >> 4;
      flat2_p[4][0]._4_2_ = (ushort)(sVar84 * 5 + sVar31 + sVar56) >> 4;
      flat2_p[4][0]._6_2_ = (ushort)(sVar85 * 5 + sVar36 + sVar57) >> 4;
      flat2_p[4][1]._0_2_ = (ushort)(sVar86 * 5 + sVar13 + sVar62) >> 4;
      flat2_p[4][1]._2_2_ = (ushort)(sVar87 * 5 + sVar16 + sVar63) >> 4;
      flat2_p[4][1]._4_2_ = (ushort)(sVar88 * 5 + sVar18 + sVar64) >> 4;
      flat2_p[4][1]._6_2_ = (ushort)(sVar89 * 5 + sVar20 + sVar65) >> 4;
      local_128[0x20] = (ushort)(sVar66 * 5 + local_208 + sVar25) >> 4;
      local_128[0x21] = (ushort)(sVar67 * 5 + sStack_206 + sVar29) >> 4;
      local_128[0x22] = (ushort)(sVar68 * 5 + sStack_204 + sVar34) >> 4;
      local_128[0x23] = (ushort)(sVar69 * 5 + sStack_202 + sVar38) >> 4;
      local_128[0x24] = (ushort)(sVar70 * 5 + sStack_200 + sVar49) >> 4;
      local_128[0x25] = (ushort)(sVar71 * 5 + sStack_1fe + sVar51) >> 4;
      local_128[0x26] = (ushort)(sVar72 * 5 + sStack_1fc + sVar52) >> 4;
      local_128[0x27] = (ushort)(sVar73 * 5 + sVar39 + sVar53) >> 4;
      flat2_p[5][0]._0_2_ =
           (ushort)(((local_2a8 + local_298) - (short)local_268) + sVar82 * 7 + sVar54) >> 4;
      flat2_p[5][0]._2_2_ =
           (ushort)(((sStack_2a6 + sStack_296) - local_268._2_2_) + sVar83 * 7 + sVar55) >> 4;
      flat2_p[5][0]._4_2_ =
           (ushort)(((sStack_2a4 + sStack_294) - local_268._4_2_) + sVar84 * 7 + sVar56) >> 4;
      flat2_p[5][0]._6_2_ =
           (ushort)(((sStack_2a2 + sStack_292) - local_268._6_2_) + sVar85 * 7 + sVar57) >> 4;
      flat2_p[5][1]._0_2_ =
           (ushort)(((sStack_2a0 + sStack_290) - (short)uStack_260) + sVar86 * 7 + sVar62) >> 4;
      flat2_p[5][1]._2_2_ =
           (ushort)(((sStack_29e + sStack_28e) - uStack_260._2_2_) + sVar87 * 7 + sVar63) >> 4;
      flat2_p[5][1]._4_2_ =
           (ushort)(((sStack_29c + sStack_28c) - uStack_260._4_2_) + sVar88 * 7 + sVar64) >> 4;
      flat2_p[5][1]._6_2_ =
           (ushort)(((sStack_29a + sStack_28a) - uStack_260._6_2_) + sVar89 * 7 + sVar65) >> 4;
      local_128[0x28] =
           (ushort)(((local_228 + local_238) - (short)local_2d8) + sVar66 * 7 + sVar25) >> 4;
      local_128[0x29] =
           (ushort)(((sStack_226 + sStack_236) - local_2d8._2_2_) + sVar67 * 7 + sVar29) >> 4;
      local_128[0x2a] =
           (ushort)(((sStack_224 + sStack_234) - local_2d8._4_2_) + sVar68 * 7 + sVar34) >> 4;
      local_128[0x2b] =
           (ushort)(((sStack_222 + sStack_232) - local_2d8._6_2_) + sVar69 * 7 + sVar38) >> 4;
      local_128[0x2c] =
           (ushort)(((sStack_220 + sStack_230) - (short)uStack_2d0) + sVar70 * 7 + sVar49) >> 4;
      local_128[0x2d] =
           (ushort)(((sStack_21e + sStack_22e) - uStack_2d0._2_2_) + sVar71 * 7 + sVar51) >> 4;
      local_128[0x2e] =
           (ushort)(((sStack_21c + sStack_22c) - uStack_2d0._4_2_) + sVar72 * 7 + sVar52) >> 4;
      local_128[0x2f] =
           (ushort)(((sStack_21a + sStack_22a) - uStack_2d0._6_2_) + sVar73 * 7 + sVar53) >> 4;
    }
    uVar7 = local_358 ^ 0xffff;
    uVar10 = uStack_356 ^ 0xffff;
    uVar11 = uStack_354 ^ 0xffff;
    uVar12 = uStack_352 ^ 0xffff;
    uVar14 = uStack_350 ^ 0xffff;
    uVar17 = uStack_34e ^ 0xffff;
    uVar19 = uStack_34c ^ 0xffff;
    uVar21 = uStack_34a ^ 0xffff;
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 0x10) {
      uVar23 = *(ushort *)((long)ps[0] + lVar5) & uVar7;
      uVar26 = *(ushort *)((long)ps[0] + lVar5 + 2) & uVar10;
      uVar28 = *(ushort *)((long)ps[0] + lVar5 + 4) & uVar11;
      uVar30 = *(ushort *)((long)ps[0] + lVar5 + 6) & uVar12;
      uVar32 = *(ushort *)((long)ps[0] + lVar5 + 8) & uVar14;
      uVar35 = *(ushort *)((long)ps[0] + lVar5 + 10) & uVar17;
      uVar37 = *(ushort *)((long)ps[0] + lVar5 + 0xc) & uVar19;
      uVar40 = *(ushort *)((long)ps[0] + lVar5 + 0xe) & uVar21;
      *(ushort *)((long)ps[0] + lVar5) = uVar23;
      *(ushort *)((long)ps[0] + lVar5 + 2) = uVar26;
      *(ushort *)((long)ps[0] + lVar5 + 4) = uVar28;
      *(ushort *)((long)ps[0] + lVar5 + 6) = uVar30;
      *(ushort *)((long)ps[0] + lVar5 + 8) = uVar32;
      *(ushort *)((long)ps[0] + lVar5 + 10) = uVar35;
      *(ushort *)((long)ps[0] + lVar5 + 0xc) = uVar37;
      *(ushort *)((long)ps[0] + lVar5 + 0xe) = uVar40;
      uVar41 = *(ushort *)((long)flat_p[0] + lVar5) & local_358;
      uVar42 = *(ushort *)((long)flat_p[0] + lVar5 + 2) & uStack_356;
      uVar43 = *(ushort *)((long)flat_p[0] + lVar5 + 4) & uStack_354;
      uVar44 = *(ushort *)((long)flat_p[0] + lVar5 + 6) & uStack_352;
      uVar45 = *(ushort *)((long)flat_p[0] + lVar5 + 8) & uStack_350;
      uVar46 = *(ushort *)((long)flat_p[0] + lVar5 + 10) & uStack_34e;
      uVar47 = *(ushort *)((long)flat_p[0] + lVar5 + 0xc) & uStack_34c;
      uVar48 = *(ushort *)((long)flat_p[0] + lVar5 + 0xe) & uStack_34a;
      *(ushort *)((long)flat_p[0] + lVar5) = uVar41;
      *(ushort *)((long)flat_p[0] + lVar5 + 2) = uVar42;
      *(ushort *)((long)flat_p[0] + lVar5 + 4) = uVar43;
      *(ushort *)((long)flat_p[0] + lVar5 + 6) = uVar44;
      *(ushort *)((long)flat_p[0] + lVar5 + 8) = uVar45;
      *(ushort *)((long)flat_p[0] + lVar5 + 10) = uVar46;
      *(ushort *)((long)flat_p[0] + lVar5 + 0xc) = uVar47;
      *(ushort *)((long)flat_p[0] + lVar5 + 0xe) = uVar48;
      *(ushort *)((long)&local_2e8 + lVar5) = uVar41 | uVar23;
      *(ushort *)((long)&local_2e8 + lVar5 + 2) = uVar42 | uVar26;
      *(ushort *)((long)&local_2e8 + lVar5 + 4) = uVar43 | uVar28;
      *(ushort *)((long)&local_2e8 + lVar5 + 6) = uVar44 | uVar30;
      *(ushort *)((long)&uStack_2e0 + lVar5) = uVar45 | uVar32;
      *(ushort *)((long)&uStack_2e0 + lVar5 + 2) = uVar46 | uVar35;
      *(ushort *)((long)&uStack_2e0 + lVar5 + 4) = uVar47 | uVar37;
      *(ushort *)((long)&uStack_2e0 + lVar5 + 6) = uVar48 | uVar40;
      uVar23 = *(ushort *)((long)qs[0] + lVar5) & uVar7;
      uVar26 = *(ushort *)((long)qs[0] + lVar5 + 2) & uVar10;
      uVar28 = *(ushort *)((long)qs[0] + lVar5 + 4) & uVar11;
      uVar30 = *(ushort *)((long)qs[0] + lVar5 + 6) & uVar12;
      uVar32 = *(ushort *)((long)qs[0] + lVar5 + 8) & uVar14;
      uVar35 = *(ushort *)((long)qs[0] + lVar5 + 10) & uVar17;
      uVar37 = *(ushort *)((long)qs[0] + lVar5 + 0xc) & uVar19;
      uVar40 = *(ushort *)((long)qs[0] + lVar5 + 0xe) & uVar21;
      *(ushort *)((long)qs[0] + lVar5) = uVar23;
      *(ushort *)((long)qs[0] + lVar5 + 2) = uVar26;
      *(ushort *)((long)qs[0] + lVar5 + 4) = uVar28;
      *(ushort *)((long)qs[0] + lVar5 + 6) = uVar30;
      *(ushort *)((long)qs[0] + lVar5 + 8) = uVar32;
      *(ushort *)((long)qs[0] + lVar5 + 10) = uVar35;
      *(ushort *)((long)qs[0] + lVar5 + 0xc) = uVar37;
      *(ushort *)((long)qs[0] + lVar5 + 0xe) = uVar40;
      uVar41 = *(ushort *)((long)flat_q[0] + lVar5) & local_358;
      uVar42 = *(ushort *)((long)flat_q[0] + lVar5 + 2) & uStack_356;
      uVar43 = *(ushort *)((long)flat_q[0] + lVar5 + 4) & uStack_354;
      uVar44 = *(ushort *)((long)flat_q[0] + lVar5 + 6) & uStack_352;
      uVar45 = *(ushort *)((long)flat_q[0] + lVar5 + 8) & uStack_350;
      uVar46 = *(ushort *)((long)flat_q[0] + lVar5 + 10) & uStack_34e;
      uVar47 = *(ushort *)((long)flat_q[0] + lVar5 + 0xc) & uStack_34c;
      uVar48 = *(ushort *)((long)flat_q[0] + lVar5 + 0xe) & uStack_34a;
      *(ushort *)((long)flat_q[0] + lVar5) = uVar41;
      *(ushort *)((long)flat_q[0] + lVar5 + 2) = uVar42;
      *(ushort *)((long)flat_q[0] + lVar5 + 4) = uVar43;
      *(ushort *)((long)flat_q[0] + lVar5 + 6) = uVar44;
      *(ushort *)((long)flat_q[0] + lVar5 + 8) = uVar45;
      *(ushort *)((long)flat_q[0] + lVar5 + 10) = uVar46;
      *(ushort *)((long)flat_q[0] + lVar5 + 0xc) = uVar47;
      *(ushort *)((long)flat_q[0] + lVar5 + 0xe) = uVar48;
      *(ushort *)((long)&local_278 + lVar5) = uVar41 | uVar23;
      *(ushort *)((long)&local_278 + lVar5 + 2) = uVar42 | uVar26;
      *(ushort *)((long)&local_278 + lVar5 + 4) = uVar43 | uVar28;
      *(ushort *)((long)&local_278 + lVar5 + 6) = uVar44 | uVar30;
      *(ushort *)((long)&uStack_270 + lVar5) = uVar45 | uVar32;
      *(ushort *)((long)&uStack_270 + lVar5 + 2) = uVar46 | uVar35;
      *(ushort *)((long)&uStack_270 + lVar5 + 4) = uVar47 | uVar37;
      *(ushort *)((long)&uStack_270 + lVar5 + 6) = uVar48 | uVar40;
    }
    flat_p[2][0]._0_2_ = (ushort)flat_p[2][0] & local_358;
    flat_p[2][0]._2_2_ = flat_p[2][0]._2_2_ & uStack_356;
    flat_p[2][0]._4_2_ = flat_p[2][0]._4_2_ & uStack_354;
    flat_p[2][0]._6_2_ = flat_p[2][0]._6_2_ & uStack_352;
    flat_p[2][1]._0_2_ = (ushort)flat_p[2][1] & uStack_350;
    flat_p[2][1]._2_2_ = flat_p[2][1]._2_2_ & uStack_34e;
    flat_p[2][1]._4_2_ = flat_p[2][1]._4_2_ & uStack_34c;
    flat_p[2][1]._6_2_ = flat_p[2][1]._6_2_ & uStack_34a;
    local_2c8 = (ushort)flat_p[2][0] | local_2c8 & uVar7;
    uStack_2c6 = flat_p[2][0]._2_2_ | uStack_2c6 & uVar10;
    uStack_2c4 = flat_p[2][0]._4_2_ | uStack_2c4 & uVar11;
    uStack_2c2 = flat_p[2][0]._6_2_ | uStack_2c2 & uVar12;
    uStack_2c0 = (ushort)flat_p[2][1] | uStack_2c0 & uVar14;
    uStack_2be = flat_p[2][1]._2_2_ | uStack_2be & uVar17;
    uStack_2bc = flat_p[2][1]._4_2_ | uStack_2bc & uVar19;
    uStack_2ba = flat_p[2][1]._6_2_ | uStack_2ba & uVar21;
    flat_q[2][0]._0_2_ = (ushort)flat_q[2][0] & local_358;
    flat_q[2][0]._2_2_ = flat_q[2][0]._2_2_ & uStack_356;
    flat_q[2][0]._4_2_ = flat_q[2][0]._4_2_ & uStack_354;
    flat_q[2][0]._6_2_ = flat_q[2][0]._6_2_ & uStack_352;
    flat_q[2][1]._0_2_ = (ushort)flat_q[2][1] & uStack_350;
    flat_q[2][1]._2_2_ = flat_q[2][1]._2_2_ & uStack_34e;
    flat_q[2][1]._4_2_ = flat_q[2][1]._4_2_ & uStack_34c;
    flat_q[2][1]._6_2_ = flat_q[2][1]._6_2_ & uStack_34a;
    local_258 = (ushort)flat_q[2][0] | local_258 & uVar7;
    uStack_256 = flat_q[2][0]._2_2_ | uStack_256 & uVar10;
    uStack_254 = flat_q[2][0]._4_2_ | uStack_254 & uVar11;
    uStack_252 = flat_q[2][0]._6_2_ | uStack_252 & uVar12;
    uStack_250 = (ushort)flat_q[2][1] | uStack_250 & uVar14;
    uStack_24e = flat_q[2][1]._2_2_ | uStack_24e & uVar17;
    uStack_24c = flat_q[2][1]._4_2_ | uStack_24c & uVar19;
    uStack_24a = flat_q[2][1]._6_2_ | uStack_24a & uVar21;
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 0x10) {
      uVar23 = *(ushort *)((long)ps[0] + lVar5) & uVar7;
      uVar26 = *(ushort *)((long)ps[0] + lVar5 + 2) & uVar10;
      uVar28 = *(ushort *)((long)ps[0] + lVar5 + 4) & uVar11;
      uVar30 = *(ushort *)((long)ps[0] + lVar5 + 6) & uVar12;
      uVar32 = *(ushort *)((long)ps[0] + lVar5 + 8) & uVar14;
      uVar35 = *(ushort *)((long)ps[0] + lVar5 + 10) & uVar17;
      uVar37 = *(ushort *)((long)ps[0] + lVar5 + 0xc) & uVar19;
      uVar40 = *(ushort *)((long)ps[0] + lVar5 + 0xe) & uVar21;
      *(ushort *)((long)ps[0] + lVar5) = uVar23;
      *(ushort *)((long)ps[0] + lVar5 + 2) = uVar26;
      *(ushort *)((long)ps[0] + lVar5 + 4) = uVar28;
      *(ushort *)((long)ps[0] + lVar5 + 6) = uVar30;
      *(ushort *)((long)ps[0] + lVar5 + 8) = uVar32;
      *(ushort *)((long)ps[0] + lVar5 + 10) = uVar35;
      *(ushort *)((long)ps[0] + lVar5 + 0xc) = uVar37;
      *(ushort *)((long)ps[0] + lVar5 + 0xe) = uVar40;
      uVar41 = *(ushort *)((long)flat_p[0] + lVar5) & local_358;
      uVar42 = *(ushort *)((long)flat_p[0] + lVar5 + 2) & uStack_356;
      uVar43 = *(ushort *)((long)flat_p[0] + lVar5 + 4) & uStack_354;
      uVar44 = *(ushort *)((long)flat_p[0] + lVar5 + 6) & uStack_352;
      uVar45 = *(ushort *)((long)flat_p[0] + lVar5 + 8) & uStack_350;
      uVar46 = *(ushort *)((long)flat_p[0] + lVar5 + 10) & uStack_34e;
      uVar47 = *(ushort *)((long)flat_p[0] + lVar5 + 0xc) & uStack_34c;
      uVar48 = *(ushort *)((long)flat_p[0] + lVar5 + 0xe) & uStack_34a;
      *(ushort *)((long)flat_p[0] + lVar5) = uVar41;
      *(ushort *)((long)flat_p[0] + lVar5 + 2) = uVar42;
      *(ushort *)((long)flat_p[0] + lVar5 + 4) = uVar43;
      *(ushort *)((long)flat_p[0] + lVar5 + 6) = uVar44;
      *(ushort *)((long)flat_p[0] + lVar5 + 8) = uVar45;
      *(ushort *)((long)flat_p[0] + lVar5 + 10) = uVar46;
      *(ushort *)((long)flat_p[0] + lVar5 + 0xc) = uVar47;
      *(ushort *)((long)flat_p[0] + lVar5 + 0xe) = uVar48;
      *(ushort *)((long)&local_2e8 + lVar5) = uVar41 | uVar23;
      *(ushort *)((long)&local_2e8 + lVar5 + 2) = uVar42 | uVar26;
      *(ushort *)((long)&local_2e8 + lVar5 + 4) = uVar43 | uVar28;
      *(ushort *)((long)&local_2e8 + lVar5 + 6) = uVar44 | uVar30;
      *(ushort *)((long)&uStack_2e0 + lVar5) = uVar45 | uVar32;
      *(ushort *)((long)&uStack_2e0 + lVar5 + 2) = uVar46 | uVar35;
      *(ushort *)((long)&uStack_2e0 + lVar5 + 4) = uVar47 | uVar37;
      *(ushort *)((long)&uStack_2e0 + lVar5 + 6) = uVar48 | uVar40;
      uVar23 = *(ushort *)((long)qs[0] + lVar5) & uVar7;
      uVar26 = *(ushort *)((long)qs[0] + lVar5 + 2) & uVar10;
      uVar28 = *(ushort *)((long)qs[0] + lVar5 + 4) & uVar11;
      uVar30 = *(ushort *)((long)qs[0] + lVar5 + 6) & uVar12;
      uVar32 = *(ushort *)((long)qs[0] + lVar5 + 8) & uVar14;
      uVar35 = *(ushort *)((long)qs[0] + lVar5 + 10) & uVar17;
      uVar37 = *(ushort *)((long)qs[0] + lVar5 + 0xc) & uVar19;
      uVar40 = *(ushort *)((long)qs[0] + lVar5 + 0xe) & uVar21;
      *(ushort *)((long)qs[0] + lVar5) = uVar23;
      *(ushort *)((long)qs[0] + lVar5 + 2) = uVar26;
      *(ushort *)((long)qs[0] + lVar5 + 4) = uVar28;
      *(ushort *)((long)qs[0] + lVar5 + 6) = uVar30;
      *(ushort *)((long)qs[0] + lVar5 + 8) = uVar32;
      *(ushort *)((long)qs[0] + lVar5 + 10) = uVar35;
      *(ushort *)((long)qs[0] + lVar5 + 0xc) = uVar37;
      *(ushort *)((long)qs[0] + lVar5 + 0xe) = uVar40;
      uVar41 = *(ushort *)((long)flat_q[0] + lVar5) & local_358;
      uVar42 = *(ushort *)((long)flat_q[0] + lVar5 + 2) & uStack_356;
      uVar43 = *(ushort *)((long)flat_q[0] + lVar5 + 4) & uStack_354;
      uVar44 = *(ushort *)((long)flat_q[0] + lVar5 + 6) & uStack_352;
      uVar45 = *(ushort *)((long)flat_q[0] + lVar5 + 8) & uStack_350;
      uVar46 = *(ushort *)((long)flat_q[0] + lVar5 + 10) & uStack_34e;
      uVar47 = *(ushort *)((long)flat_q[0] + lVar5 + 0xc) & uStack_34c;
      uVar48 = *(ushort *)((long)flat_q[0] + lVar5 + 0xe) & uStack_34a;
      *(ushort *)((long)flat_q[0] + lVar5) = uVar41;
      *(ushort *)((long)flat_q[0] + lVar5 + 2) = uVar42;
      *(ushort *)((long)flat_q[0] + lVar5 + 4) = uVar43;
      *(ushort *)((long)flat_q[0] + lVar5 + 6) = uVar44;
      *(ushort *)((long)flat_q[0] + lVar5 + 8) = uVar45;
      *(ushort *)((long)flat_q[0] + lVar5 + 10) = uVar46;
      *(ushort *)((long)flat_q[0] + lVar5 + 0xc) = uVar47;
      *(ushort *)((long)flat_q[0] + lVar5 + 0xe) = uVar48;
      *(ushort *)((long)&local_278 + lVar5) = uVar41 | uVar23;
      *(ushort *)((long)&local_278 + lVar5 + 2) = uVar42 | uVar26;
      *(ushort *)((long)&local_278 + lVar5 + 4) = uVar43 | uVar28;
      *(ushort *)((long)&local_278 + lVar5 + 6) = uVar44 | uVar30;
      *(ushort *)((long)&uStack_270 + lVar5) = uVar45 | uVar32;
      *(ushort *)((long)&uStack_270 + lVar5 + 2) = uVar46 | uVar35;
      *(ushort *)((long)&uStack_270 + lVar5 + 4) = uVar47 | uVar37;
      *(ushort *)((long)&uStack_270 + lVar5 + 6) = uVar48 | uVar40;
    }
    if (uVar2 != 0) {
      for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 0x10) {
        uVar2 = *(ushort *)((long)&local_2e8 + lVar5);
        uVar7 = *(ushort *)((long)&local_2e8 + lVar5 + 2);
        uVar10 = *(ushort *)((long)&local_2e8 + lVar5 + 4);
        uVar11 = *(ushort *)((long)&local_2e8 + lVar5 + 6);
        uVar12 = *(ushort *)((long)&uStack_2e0 + lVar5);
        uVar14 = *(ushort *)((long)&uStack_2e0 + lVar5 + 2);
        uVar17 = *(ushort *)((long)&uStack_2e0 + lVar5 + 4);
        uVar19 = *(ushort *)((long)&uStack_2e0 + lVar5 + 6);
        uVar21 = *(ushort *)((long)flat2_p[0] + lVar5) & local_368;
        uVar23 = *(ushort *)((long)flat2_p[0] + lVar5 + 2) & uStack_366;
        uVar26 = *(ushort *)((long)flat2_p[0] + lVar5 + 4) & uStack_364;
        uVar28 = *(ushort *)((long)flat2_p[0] + lVar5 + 6) & uStack_362;
        uVar30 = *(ushort *)((long)flat2_p[0] + lVar5 + 8) & uStack_360;
        uVar32 = *(ushort *)((long)flat2_p[0] + lVar5 + 10) & uStack_35e;
        uVar35 = *(ushort *)((long)flat2_p[0] + lVar5 + 0xc) & uStack_35c;
        uVar37 = *(ushort *)((long)flat2_p[0] + lVar5 + 0xe) & uStack_35a;
        *(ushort *)((long)flat2_p[0] + lVar5) = uVar21;
        *(ushort *)((long)flat2_p[0] + lVar5 + 2) = uVar23;
        *(ushort *)((long)flat2_p[0] + lVar5 + 4) = uVar26;
        *(ushort *)((long)flat2_p[0] + lVar5 + 6) = uVar28;
        *(ushort *)((long)flat2_p[0] + lVar5 + 8) = uVar30;
        *(ushort *)((long)flat2_p[0] + lVar5 + 10) = uVar32;
        *(ushort *)((long)flat2_p[0] + lVar5 + 0xc) = uVar35;
        *(ushort *)((long)flat2_p[0] + lVar5 + 0xe) = uVar37;
        *(ushort *)((long)&local_2e8 + lVar5) = uVar21 | uVar2 & (local_368 ^ 0xffff);
        *(ushort *)((long)&local_2e8 + lVar5 + 2) = uVar23 | uVar7 & (uStack_366 ^ 0xffff);
        *(ushort *)((long)&local_2e8 + lVar5 + 4) = uVar26 | uVar10 & (uStack_364 ^ 0xffff);
        *(ushort *)((long)&local_2e8 + lVar5 + 6) = uVar28 | uVar11 & (uStack_362 ^ 0xffff);
        *(ushort *)((long)&uStack_2e0 + lVar5) = uVar30 | uVar12 & (uStack_360 ^ 0xffff);
        *(ushort *)((long)&uStack_2e0 + lVar5 + 2) = uVar32 | uVar14 & (uStack_35e ^ 0xffff);
        *(ushort *)((long)&uStack_2e0 + lVar5 + 4) = uVar35 | uVar17 & (uStack_35c ^ 0xffff);
        *(ushort *)((long)&uStack_2e0 + lVar5 + 6) = uVar37 | uVar19 & (uStack_35a ^ 0xffff);
        uVar2 = *(ushort *)((long)&local_278 + lVar5);
        uVar7 = *(ushort *)((long)&local_278 + lVar5 + 2);
        uVar10 = *(ushort *)((long)&local_278 + lVar5 + 4);
        uVar11 = *(ushort *)((long)&local_278 + lVar5 + 6);
        uVar12 = *(ushort *)((long)&uStack_270 + lVar5);
        uVar14 = *(ushort *)((long)&uStack_270 + lVar5 + 2);
        uVar17 = *(ushort *)((long)&uStack_270 + lVar5 + 4);
        uVar19 = *(ushort *)((long)&uStack_270 + lVar5 + 6);
        uVar21 = *(ushort *)((long)local_128 + lVar5) & local_368;
        uVar23 = *(ushort *)((long)local_128 + lVar5 + 2) & uStack_366;
        uVar26 = *(ushort *)((long)local_128 + lVar5 + 4) & uStack_364;
        uVar28 = *(ushort *)((long)local_128 + lVar5 + 6) & uStack_362;
        uVar30 = *(ushort *)((long)local_128 + lVar5 + 8) & uStack_360;
        uVar32 = *(ushort *)((long)local_128 + lVar5 + 10) & uStack_35e;
        uVar35 = *(ushort *)((long)local_128 + lVar5 + 0xc) & uStack_35c;
        uVar37 = *(ushort *)((long)local_128 + lVar5 + 0xe) & uStack_35a;
        *(ushort *)((long)local_128 + lVar5) = uVar21;
        *(ushort *)((long)local_128 + lVar5 + 2) = uVar23;
        *(ushort *)((long)local_128 + lVar5 + 4) = uVar26;
        *(ushort *)((long)local_128 + lVar5 + 6) = uVar28;
        *(ushort *)((long)local_128 + lVar5 + 8) = uVar30;
        *(ushort *)((long)local_128 + lVar5 + 10) = uVar32;
        *(ushort *)((long)local_128 + lVar5 + 0xc) = uVar35;
        *(ushort *)((long)local_128 + lVar5 + 0xe) = uVar37;
        *(ushort *)((long)&local_278 + lVar5) = uVar21 | uVar2 & (local_368 ^ 0xffff);
        *(ushort *)((long)&local_278 + lVar5 + 2) = uVar23 | uVar7 & (uStack_366 ^ 0xffff);
        *(ushort *)((long)&local_278 + lVar5 + 4) = uVar26 | uVar10 & (uStack_364 ^ 0xffff);
        *(ushort *)((long)&local_278 + lVar5 + 6) = uVar28 | uVar11 & (uStack_362 ^ 0xffff);
        *(ushort *)((long)&uStack_270 + lVar5) = uVar30 | uVar12 & (uStack_360 ^ 0xffff);
        *(ushort *)((long)&uStack_270 + lVar5 + 2) = uVar32 | uVar14 & (uStack_35e ^ 0xffff);
        *(ushort *)((long)&uStack_270 + lVar5 + 4) = uVar35 | uVar17 & (uStack_35c ^ 0xffff);
        *(ushort *)((long)&uStack_270 + lVar5 + 6) = uVar37 | uVar19 & (uStack_35a ^ 0xffff);
      }
    }
  }
  puVar3 = s + -lVar6;
  for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 0x10) {
    uVar1 = *(undefined8 *)((long)&uStack_2e0 + lVar5);
    *(undefined8 *)puVar3 = *(undefined8 *)((long)&local_2e8 + lVar5);
    *(undefined8 *)(puVar3 + 4) = uVar1;
    uVar1 = *(undefined8 *)((long)&uStack_270 + lVar5);
    *(undefined8 *)s = *(undefined8 *)((long)&local_278 + lVar5);
    *(undefined8 *)(s + 4) = uVar1;
    puVar3 = puVar3 + -lVar6;
    s = s + lVar6;
  }
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_14_dual_sse2(
    uint16_t *s, int pitch, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p[7], q[7];
  int i;
  load_highbd_pixel(s, 7, pitch, p, q);

  highbd_lpf_internal_14_dual_sse2(p, q, _blimit0, _limit0, _thresh0, _blimit1,
                                   _limit1, _thresh1, bd);

  for (i = 0; i < 6; i++) {
    _mm_storeu_si128((__m128i *)(s - (i + 1) * pitch), p[i]);
    _mm_storeu_si128((__m128i *)(s + i * pitch), q[i]);
  }
}